

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

bean_ptr<X> * __thiscall
hiberlite::Database::copyBean<X>(bean_ptr<X> *__return_storage_ptr__,Database *this,X *c)

{
  X *this_00;
  
  this_00 = (X *)operator_new(0x78);
  X::X(this_00,c);
  manageBean<X>(__return_storage_ptr__,this,this_00);
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Database::copyBean(const C& c)
{
	return manageBean<C>( new C(c) );
}